

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

string * __thiscall
flatbuffers::ts::TsGenerator::GenWriteMethod_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,Type *type)

{
  uint uVar1;
  BaseType BVar2;
  EnumDef *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  StructDef *pSVar6;
  EnumDef *pEVar7;
  undefined8 uVar8;
  char *pcVar9;
  undefined1 local_48 [32];
  
  BVar2 = type->base_type;
  uVar1 = BVar2 - BASE_TYPE_UTYPE;
  switch(uVar1) {
  case 0:
    pEVar3 = type->enum_def;
    if ((pEVar3 == (EnumDef *)0x0) || ((pEVar3->underlying_type).base_type == BVar2)) {
      local_48._0_4_ = BASE_TYPE_UCHAR;
      local_48._4_4_ = BASE_TYPE_NONE;
      local_48._8_4_ = 0;
      local_48._12_4_ = 0;
      local_48._16_2_ = 0;
      local_48._18_2_ = 0;
      local_48._20_4_ = 0;
      local_48._24_2_ = 0;
    }
    else {
      uVar4 = (pEVar3->underlying_type).base_type;
      uVar5 = (pEVar3->underlying_type).element;
      pSVar6 = (pEVar3->underlying_type).struct_def;
      pEVar7 = (pEVar3->underlying_type).enum_def;
      uVar8 = *(undefined8 *)&(pEVar3->underlying_type).fixed_length;
      local_48._16_2_ = SUB82(pEVar7,0);
      local_48._18_2_ = (undefined2)((ulong)pEVar7 >> 0x10);
      local_48._20_4_ = (undefined4)((ulong)pEVar7 >> 0x20);
      local_48._24_2_ = (undefined2)uVar8;
      local_48._26_6_ = (undefined6)((ulong)uVar8 >> 0x10);
      local_48._8_4_ = SUB84(pSVar6,0);
      local_48._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
      local_48._0_4_ = uVar4;
      local_48._4_4_ = uVar5;
    }
    goto LAB_00265b25;
  default:
    if (uVar1 < 0xc) {
      GenType_abi_cxx11_((string *)local_48,(TsGenerator *)type,type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (__return_storage_ptr__,&this->namer_,local_48,
                 (ulong)(this->namer_).super_Namer.config_.types);
    }
    else {
      if (BVar2 == BASE_TYPE_STRUCT) {
        pcVar9 = "Offset";
        if (type->struct_def->fixed != false) {
          pcVar9 = "Struct";
        }
      }
      else {
        pcVar9 = "Offset";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar9,pcVar9 + 6);
    }
    if (0xb < uVar1) {
      return __return_storage_ptr__;
    }
    if ((undefined1 *)CONCAT44(local_48._4_4_,local_48._0_4_) == local_48 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((undefined1 *)CONCAT44(local_48._4_4_,local_48._0_4_),
                    CONCAT44(local_48._20_4_,CONCAT22(local_48._18_2_,local_48._16_2_)) + 1);
    return __return_storage_ptr__;
  case 3:
    local_48._0_4_ = BASE_TYPE_CHAR;
    break;
  case 5:
    local_48._0_4_ = BASE_TYPE_SHORT;
    break;
  case 7:
    local_48._0_4_ = BASE_TYPE_INT;
    break;
  case 9:
    local_48._0_4_ = BASE_TYPE_LONG;
  }
  local_48._4_4_ = BASE_TYPE_NONE;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_2_ = 0;
  local_48._18_2_ = 0;
  local_48._20_4_ = 0;
  local_48._24_2_ = 0;
LAB_00265b25:
  GenWriteMethod_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GenWriteMethod(const Type &type) {
    // Forward to signed versions since unsigned versions don't exist
    switch (type.base_type) {
      case BASE_TYPE_UTYPE: return GenWriteMethod(GetUnionUnderlyingType(type));
      case BASE_TYPE_UCHAR: return GenWriteMethod(Type(BASE_TYPE_CHAR));
      case BASE_TYPE_USHORT: return GenWriteMethod(Type(BASE_TYPE_SHORT));
      case BASE_TYPE_UINT: return GenWriteMethod(Type(BASE_TYPE_INT));
      case BASE_TYPE_ULONG: return GenWriteMethod(Type(BASE_TYPE_LONG));
      default: break;
    }

    return IsScalar(type.base_type) ? namer_.Type(GenType(type))
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }